

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_av1d_vdpu383.c
# Opt level: O0

void vdpu383_av1d_rcb_reg_cfg(Av1dHalCtx *p_hal,MppBuffer buf)

{
  long *plVar1;
  long lVar2;
  int iVar3;
  uint local_30;
  RK_U32 i;
  RK_U32 fd;
  Vdpu383Av1dRegSet *regs;
  Vdpu383Av1dRegCtx *reg_ctx;
  MppBuffer buf_local;
  Av1dHalCtx *p_hal_local;
  
  plVar1 = (long *)p_hal->reg_ctx;
  lVar2 = *plVar1;
  iVar3 = mpp_buffer_get_fd_with_caller(buf,"vdpu383_av1d_rcb_reg_cfg");
  *(int *)(lVar2 + 0x90) = iVar3;
  *(int *)(lVar2 + 0x98) = iVar3;
  *(int *)(lVar2 + 0xa0) = iVar3;
  *(int *)(lVar2 + 0xa8) = iVar3;
  *(int *)(lVar2 + 0xb0) = iVar3;
  *(int *)(lVar2 + 0xb8) = iVar3;
  *(int *)(lVar2 + 0xc0) = iVar3;
  *(int *)(lVar2 + 200) = iVar3;
  *(int *)(lVar2 + 0xd0) = iVar3;
  *(int *)(lVar2 + 0xd8) = iVar3;
  *(int *)(lVar2 + 0xe0) = iVar3;
  *(int *)(lVar2 + 0x94) = (int)plVar1[0xd];
  *(undefined4 *)(lVar2 + 0x9c) = *(undefined4 *)((long)plVar1 + 0x74);
  *(int *)(lVar2 + 0xa4) = (int)plVar1[0x10];
  *(undefined4 *)(lVar2 + 0xac) = *(undefined4 *)((long)plVar1 + 0x8c);
  *(int *)(lVar2 + 0xb4) = (int)plVar1[0x13];
  *(undefined4 *)(lVar2 + 0xbc) = *(undefined4 *)((long)plVar1 + 0xa4);
  *(int *)(lVar2 + 0xc4) = (int)plVar1[0x16];
  *(undefined4 *)(lVar2 + 0xcc) = *(undefined4 *)((long)plVar1 + 0xbc);
  *(int *)(lVar2 + 0xd4) = (int)plVar1[0x19];
  *(undefined4 *)(lVar2 + 0xdc) = *(undefined4 *)((long)plVar1 + 0xd4);
  *(int *)(lVar2 + 0xe4) = (int)plVar1[0x1c];
  for (local_30 = 0; local_30 < 0xb; local_30 = local_30 + 1) {
    mpp_dev_set_reg_offset
              (p_hal->dev,*(RK_S32 *)((long)plVar1 + (ulong)local_30 * 0xc + 100),
               *(RK_U32 *)((long)plVar1 + (ulong)local_30 * 0xc + 0x6c));
  }
  return;
}

Assistant:

static void vdpu383_av1d_rcb_reg_cfg(Av1dHalCtx *p_hal, MppBuffer buf)
{
    Vdpu383Av1dRegCtx *reg_ctx = (Vdpu383Av1dRegCtx *)p_hal->reg_ctx;
    Vdpu383Av1dRegSet *regs = reg_ctx->regs;
    RK_U32 fd = mpp_buffer_get_fd(buf);
    RK_U32 i;

    regs->common_addr.reg140_rcb_strmd_row_offset           = fd;
    regs->common_addr.reg142_rcb_strmd_tile_row_offset      = fd;
    regs->common_addr.reg144_rcb_inter_row_offset           = fd;
    regs->common_addr.reg146_rcb_inter_tile_row_offset      = fd;
    regs->common_addr.reg148_rcb_intra_row_offset           = fd;
    regs->common_addr.reg150_rcb_intra_tile_row_offset      = fd;
    regs->common_addr.reg152_rcb_filterd_row_offset         = fd;
    regs->common_addr.reg154_rcb_filterd_protect_row_offset = fd;
    regs->common_addr.reg156_rcb_filterd_tile_row_offset    = fd;
    regs->common_addr.reg158_rcb_filterd_tile_col_offset    = fd;
    regs->common_addr.reg160_rcb_filterd_av1_upscale_tile_col_offset = fd;

    regs->common_addr.reg141_rcb_strmd_row_len            = reg_ctx->rcb_buf_info[RCB_STRMD_ROW].size;
    regs->common_addr.reg143_rcb_strmd_tile_row_len       = reg_ctx->rcb_buf_info[RCB_STRMD_TILE_ROW].size;
    regs->common_addr.reg145_rcb_inter_row_len            = reg_ctx->rcb_buf_info[RCB_INTER_ROW].size;
    regs->common_addr.reg147_rcb_inter_tile_row_len       = reg_ctx->rcb_buf_info[RCB_INTER_TILE_ROW].size;
    regs->common_addr.reg149_rcb_intra_row_len            = reg_ctx->rcb_buf_info[RCB_INTRA_ROW].size;
    regs->common_addr.reg151_rcb_intra_tile_row_len       = reg_ctx->rcb_buf_info[RCB_INTRA_TILE_ROW].size;
    regs->common_addr.reg153_rcb_filterd_row_len          = reg_ctx->rcb_buf_info[RCB_FILTERD_ROW].size;
    regs->common_addr.reg155_rcb_filterd_protect_row_len  = reg_ctx->rcb_buf_info[RCB_FILTERD_PROTECT_ROW].size;
    regs->common_addr.reg157_rcb_filterd_tile_row_len     = reg_ctx->rcb_buf_info[RCB_FILTERD_TILE_ROW].size;
    regs->common_addr.reg159_rcb_filterd_tile_col_len     = reg_ctx->rcb_buf_info[RCB_FILTERD_TILE_COL].size;
    regs->common_addr.reg161_rcb_filterd_av1_upscale_tile_col_len  = reg_ctx->rcb_buf_info[RCB_FILTERD_AV1_UP_TILE_COL].size;

    for (i = 0; i < RCB_BUF_COUNT; i++)
        mpp_dev_set_reg_offset(p_hal->dev, reg_ctx->rcb_buf_info[i].reg_idx, reg_ctx->rcb_buf_info[i].offset);
}